

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServer.cxx
# Opt level: O0

void __thiscall cmServerBase::StartShutDown(cmServerBase *this)

{
  bool bVar1;
  reference this_00;
  pointer pcVar2;
  unique_ptr<cmConnection,_std::default_delete<cmConnection>_> *connection;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>
  *__range1;
  unique_lock<cm::shared_mutex> lock;
  cmServerBase *this_local;
  
  lock._8_8_ = this;
  ::cm::uv_handle_ptr_base_<uv_async_s>::reset
            ((uv_handle_ptr_base_<uv_async_s> *)&this->ShutdownSignal);
  ::cm::uv_handle_ptr_base_<uv_signal_s>::reset
            ((uv_handle_ptr_base_<uv_signal_s> *)&this->SIGINTHandler);
  ::cm::uv_handle_ptr_base_<uv_signal_s>::reset
            ((uv_handle_ptr_base_<uv_signal_s> *)&this->SIGHUPHandler);
  std::unique_lock<cm::shared_mutex>::unique_lock
            ((unique_lock<cm::shared_mutex> *)&__range1,&this->ConnectionsMutex);
  __end1 = std::
           vector<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>
           ::begin(&this->Connections);
  connection = (unique_ptr<cmConnection,_std::default_delete<cmConnection>_> *)
               std::
               vector<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>
               ::end(&this->Connections);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_*,_std::vector<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>_>
                                *)&connection);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_*,_std::vector<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>_>
              ::operator*(&__end1);
    pcVar2 = std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>::operator->(this_00);
    (*pcVar2->_vptr_cmConnection[3])();
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_*,_std::vector<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>_>
    ::operator++(&__end1);
  }
  std::
  vector<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>
  ::clear(&this->Connections);
  std::unique_lock<cm::shared_mutex>::~unique_lock((unique_lock<cm::shared_mutex> *)&__range1);
  uv_walk(&this->Loop,on_walk_to_shutdown,(void *)0x0);
  return;
}

Assistant:

void cmServerBase::StartShutDown()
{
  ShutdownSignal.reset();
  SIGINTHandler.reset();
  SIGHUPHandler.reset();

  {
    std::unique_lock<cm::shared_mutex> lock(ConnectionsMutex);
    for (auto& connection : Connections) {
      connection->OnConnectionShuttingDown();
    }
    Connections.clear();
  }

  uv_walk(&Loop, on_walk_to_shutdown, nullptr);
}